

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hxx
# Opt level: O1

size_t __thiscall
andres::graph::
ComponentsByPartition<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>>::
build<lineage::ProblemGraph::SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (ComponentsByPartition<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>>
           *this,Graph *graph,
          SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *mask)

{
  long *plVar1;
  pointer pRVar2;
  pointer pRVar3;
  pointer pEVar4;
  Problem *pPVar5;
  pointer puVar6;
  long lVar7;
  pointer pEVar8;
  Value VVar9;
  Value VVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  long lVar13;
  ulong uVar14;
  long lVar15;
  size_type __new_size;
  long lVar16;
  Value VVar17;
  Value VVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  pRVar2 = (graph->vertices_).
           super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pRVar3 = (graph->vertices_).
           super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __new_size = (long)pRVar2 - (long)pRVar3 >> 5;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this,__new_size);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x18),__new_size);
  *(size_type *)(this + 0x30) = __new_size;
  auVar12 = _DAT_00125060;
  if (pRVar2 != pRVar3) {
    lVar13 = *(long *)this;
    lVar16 = __new_size - 1;
    auVar19._8_4_ = (int)lVar16;
    auVar19._0_8_ = lVar16;
    auVar19._12_4_ = (int)((ulong)lVar16 >> 0x20);
    uVar14 = 0;
    auVar19 = auVar19 ^ _DAT_00125060;
    auVar20 = _DAT_00125050;
    do {
      auVar21 = auVar20 ^ auVar12;
      if ((bool)(~(auVar21._4_4_ == auVar19._4_4_ && auVar19._0_4_ < auVar21._0_4_ ||
                  auVar19._4_4_ < auVar21._4_4_) & 1)) {
        *(ulong *)(lVar13 + uVar14 * 8) = uVar14;
      }
      if ((auVar21._12_4_ != auVar19._12_4_ || auVar21._8_4_ <= auVar19._8_4_) &&
          auVar21._12_4_ <= auVar19._12_4_) {
        *(ulong *)(lVar13 + 8 + uVar14 * 8) = uVar14 + 1;
      }
      uVar14 = uVar14 + 2;
      lVar16 = auVar20._8_8_;
      auVar20._0_8_ = auVar20._0_8_ + 2;
      auVar20._8_8_ = lVar16 + 2;
    } while ((__new_size + 1 & 0xfffffffffffffffe) != uVar14);
  }
  pEVar4 = (graph->edges_).
           super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar13 = (long)(graph->edges_).
                 super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar4;
  if (lVar13 != 0) {
    lVar13 = lVar13 >> 4;
    pPVar5 = mask->problem_;
    puVar6 = (mask->edgeLabels_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
             _M_impl.super__Vector_impl_data._M_start;
    lVar16 = *(long *)this;
    lVar7 = *(long *)(this + 0x18);
    lVar15 = 0;
    do {
      if ((puVar6[lVar15] == '\0') &&
         (pEVar8 = (pPVar5->edges).super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>
                   ._M_impl.super__Vector_impl_data._M_start, pEVar8[lVar15].t0 == pEVar8[lVar15].t1
         )) {
        VVar18 = pEVar4[lVar15].vertexIndices_[0];
        VVar9 = pEVar4[lVar15].vertexIndices_[1];
        VVar10 = VVar18;
        do {
          VVar17 = VVar10;
          VVar10 = *(Value *)(lVar16 + VVar17 * 8);
        } while (VVar10 != VVar17);
        while (VVar10 = VVar9, VVar17 != VVar18) {
          VVar10 = *(Value *)(lVar16 + VVar18 * 8);
          *(Value *)(lVar16 + VVar18 * 8) = VVar17;
          VVar18 = VVar10;
        }
        do {
          VVar18 = VVar10;
          VVar10 = *(Value *)(lVar16 + VVar18 * 8);
        } while (VVar10 != VVar18);
        while (VVar18 != VVar9) {
          VVar10 = *(Value *)(lVar16 + VVar9 * 8);
          *(Value *)(lVar16 + VVar9 * 8) = VVar18;
          VVar9 = VVar10;
        }
        uVar14 = *(ulong *)(lVar7 + VVar18 * 8);
        uVar11 = *(ulong *)(lVar7 + VVar17 * 8);
        if (uVar11 < uVar14) {
          *(Value *)(lVar16 + VVar17 * 8) = VVar18;
        }
        else if (uVar14 < uVar11) {
          *(Value *)(lVar16 + VVar18 * 8) = VVar17;
        }
        else {
          if (VVar17 == VVar18) goto LAB_0011c7a4;
          *(Value *)(lVar16 + VVar18 * 8) = VVar17;
          plVar1 = (long *)(lVar7 + VVar17 * 8);
          *plVar1 = *plVar1 + 1;
        }
        *(long *)(this + 0x30) = *(long *)(this + 0x30) + -1;
      }
LAB_0011c7a4:
      lVar15 = lVar15 + 1;
    } while (lVar15 != lVar13 + (ulong)(lVar13 == 0));
  }
  return *(size_t *)(this + 0x30);
}

Assistant:

inline std::size_t
ComponentsByPartition<GRAPH>::build(
    const Graph& graph,
    const SUBGRAPH_MASK& mask
) {
    partition_.assign(graph.numberOfVertices());
    for(std::size_t edge = 0; edge < graph.numberOfEdges(); ++edge) {
        if(mask.edge(edge)) {
            const std::size_t v0 = graph.vertexOfEdge(edge, 0);
            const std::size_t v1 = graph.vertexOfEdge(edge, 1);
            if(mask.vertex(v0) && mask.vertex(v1)) {
                partition_.merge(v0, v1);
            }
        }
    }
    return partition_.numberOfSets();
}